

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O0

int __thiscall
CVmObjVector::getp_apply_all(CVmObjVector *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  CVmRun *pCVar2;
  vm_val_t *in_RDX;
  vm_obj_id_t in_ESI;
  vm_val_t *in_RDI;
  vm_rcdesc rc;
  size_t idx;
  vm_val_t *func_val;
  undefined4 in_stack_ffffffffffffff48;
  vm_obj_id_t in_stack_ffffffffffffff4c;
  CVmRun *in_stack_ffffffffffffff50;
  uint caller_ofs;
  vm_val_t *in_stack_ffffffffffffff58;
  CVmRun *recurse_ctx;
  undefined4 in_stack_ffffffffffffff60;
  vm_obj_id_t argc_00;
  CVmRun *in_stack_ffffffffffffff70;
  vm_val_t *in_stack_ffffffffffffff78;
  unsigned_short in_stack_ffffffffffffff82;
  vm_obj_id_t in_stack_ffffffffffffff84;
  char *in_stack_ffffffffffffff88;
  vm_rcdesc *in_stack_ffffffffffffff90;
  CVmRun *local_38;
  
  if ((getp_apply_all(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_apply_all(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_apply_all::desc,1);
    __cxa_guard_release(&getp_apply_all(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  argc_00 = in_ESI;
  CVmStack::get(0);
  vm_rcdesc::vm_rcdesc
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
             in_stack_ffffffffffffff82,in_stack_ffffffffffffff78,(uint *)in_stack_ffffffffffffff70);
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffff58,(uint *)in_stack_ffffffffffffff50,
                     (CVmNativeCodeDesc *)
                     CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  if (iVar1 == 0) {
    CVmStack::get(0);
    CVmRun::push_obj(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    vm_val_t::set_obj(in_RDX,in_ESI);
    local_38 = (CVmRun *)0x0;
    while( true ) {
      caller_ofs = (uint)((ulong)in_stack_ffffffffffffff50 >> 0x20);
      recurse_ctx = local_38;
      pCVar2 = (CVmRun *)get_element_count((CVmObjVector *)0x34b940);
      if (pCVar2 <= recurse_ctx) break;
      push_element((CVmObjVector *)CONCAT44(argc_00,in_stack_ffffffffffffff60),(size_t)recurse_ctx);
      CVmRun::call_func_ptr
                (in_stack_ffffffffffffff70,in_RDI,argc_00,(vm_rcdesc *)recurse_ctx,caller_ofs);
      in_stack_ffffffffffffff50 = local_38;
      CVmRun::get_r0();
      set_element_undo((CVmObjVector *)in_stack_ffffffffffffff70,
                       (vm_obj_id_t)((ulong)in_RDI >> 0x20),
                       CONCAT44(argc_00,in_stack_ffffffffffffff60),(vm_val_t *)recurse_ctx);
      local_38 = (CVmRun *)((long)&(local_38->super_CVmStack).arr_ + 1);
    }
    CVmStack::discard(2);
  }
  return 1;
}

Assistant:

int CVmObjVector::getp_apply_all(VMG_ vm_obj_id_t self, vm_val_t *retval,
                                 uint *argc)
{
    const vm_val_t *func_val;
    size_t idx;
    static CVmNativeCodeDesc desc(1);
    vm_rcdesc rc(vmg_ "Vector.applyAll", self, 6, G_stk->get(0), argc);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the function pointer argument, but leave it on the stack */
    func_val = G_stk->get(0);

    /* push a self-reference while working to protect from gc */
    G_interpreter->push_obj(vmg_ self);

    /* 
     *   we're going to return the 'self' object, since we update the vector
     *   in-place 
     */
    retval->set_obj(self);

    /*
     *   Go through each element of our vector, invoking the callback on
     *   each element.  Replace each element with the result of the
     *   callback.  Note that we intentionally re-check the element count on
     *   each iteration, in case the callback changes the number of
     *   elements.  
     */
    for (idx = 0 ; idx < get_element_count() ; ++idx)
    {
        /* push this element as the callback's argument */
        push_element(vmg_ idx);

        /* invoke the callback */
        G_interpreter->call_func_ptr(vmg_ func_val, 1, &rc, 0);

        /* replace this element with the result */
        set_element_undo(vmg_ self, idx, G_interpreter->get_r0());
    }

    /* discard our gc protection (self) and our arguments */
    G_stk->discard(2);

    /* handled */
    return TRUE;
}